

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O2

void __thiscall ConnectFourState::print(ConnectFourState *this,ostream *out)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  int col;
  int iVar4;
  int iVar5;
  int row;
  long lVar6;
  int col_1;
  long lVar7;
  
  std::endl<char,std::char_traits<char>>(out);
  std::operator<<(out," ");
  for (iVar4 = 0; iVar5 = this->num_cols + -1, iVar4 < iVar5; iVar4 = iVar4 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar4);
    std::operator<<(poVar2,' ');
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar6 = 0; lVar6 < this->num_rows; lVar6 = lVar6 + 1) {
    std::operator<<(out,"|");
    lVar7 = 0;
    while( true ) {
      lVar3 = (long)this->num_cols + -1;
      lVar1 = *(long *)&(this->board).
                        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data;
      if (lVar3 <= lVar7) break;
      poVar2 = std::operator<<(out,*(char *)(lVar1 + lVar7));
      std::operator<<(poVar2,' ');
      lVar7 = lVar7 + 1;
    }
    poVar2 = std::operator<<(out,*(char *)(lVar1 + lVar3));
    poVar2 = std::operator<<(poVar2,"|");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::operator<<(out,"+");
  for (iVar4 = 0; iVar4 < this->num_cols + -1; iVar4 = iVar4 + 1) {
    std::operator<<(out,"--");
  }
  poVar2 = std::operator<<(out,"-+");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,".XO"[this->player_to_move]);
  poVar2 = std::operator<<(poVar2," to move ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void print(ostream& out) const
	{
		out << endl;
		out << " ";
		for (int col = 0; col < num_cols - 1; ++col) {
			out << col << ' ';
		}
		out << num_cols - 1 << endl;
		for (int row = 0; row < num_rows; ++row) {
			out << "|";
			for (int col = 0; col < num_cols - 1; ++col) {
				out << board[row][col] << ' ';
			}
			out << board[row][num_cols - 1] << "|" << endl;
		}
		out << "+";
		for (int col = 0; col < num_cols - 1; ++col) {
			out << "--";
		}
		out << "-+" << endl;
		out << player_markers[player_to_move] << " to move " << endl << endl;
	}